

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void memSwap(void *buf1,void *buf2,size_t count)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  
  for (; 7 < count; count = count - 8) {
    uVar2 = *buf1;
    uVar1 = *buf2;
    *(ulong *)buf1 = uVar2 ^ uVar1;
    uVar2 = uVar2 ^ uVar1 ^ *buf2;
    *(ulong *)buf2 = uVar2;
    *(ulong *)buf1 = *buf1 ^ uVar2;
    buf1 = (void *)((long)buf1 + 8);
    buf2 = (void *)((long)buf2 + 8);
  }
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    bVar3 = *(byte *)((long)buf1 + uVar2) ^ *(byte *)((long)buf2 + uVar2);
    *(byte *)((long)buf1 + uVar2) = bVar3;
    bVar3 = bVar3 ^ *(byte *)((long)buf2 + uVar2);
    *(byte *)((long)buf2 + uVar2) = bVar3;
    *(byte *)((long)buf1 + uVar2) = *(byte *)((long)buf1 + uVar2) ^ bVar3;
  }
  return;
}

Assistant:

void memSwap(void* buf1, void* buf2, size_t count)
{
	ASSERT(memIsDisjoint(buf1, buf2, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		SWAP(*(word*)buf1, *(word*)buf2);
		buf1 = (word*)buf1 + 1;
		buf2 = (word*)buf2 + 1;
	}
	while (count--)
	{
		SWAP(*(octet*)buf1, *(octet*)buf2);
		buf1 = (octet*)buf1 + 1;
		buf2 = (octet*)buf2 + 1;
	}
}